

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  float *pfVar1;
  int local_34;
  float local_30;
  int i;
  float w_item_last;
  float w_item_one;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float w_full_local;
  int components_local;
  
  window = (ImGuiWindow *)GImGui;
  style = (ImGuiStyle *)GImGui->CurrentWindow;
  _w_item_last = &GImGui->Style;
  g._0_4_ = w_full;
  g._4_4_ = components;
  i = (int)ImMax<float>(1.0,(float)(int)((-(GImGui->Style).ItemInnerSpacing.x *
                                          (float)(components + -1) + w_full) / (float)components));
  local_30 = ImMax<float>(1.0,(float)(int)(-((float)i + (_w_item_last->ItemInnerSpacing).x) *
                                           (float)(g._4_4_ + -1) + g._0_4_));
  ImVector<float>::push_back((ImVector<float> *)(style->Colors + 0xf),&local_30);
  for (local_34 = 0; local_34 < g._4_4_ + -1; local_34 = local_34 + 1) {
    ImVector<float>::push_back((ImVector<float> *)(style->Colors + 0xf),(float *)&i);
  }
  pfVar1 = ImVector<float>::back((ImVector<float> *)(style->Colors + 0xf));
  style->Colors[0xd].y = *pfVar1;
  window[7].DC.LastItemRect.Min.x = (float)((uint)window[7].DC.LastItemRect.Min.x & 0xfffffffe);
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = GImGui->Style;
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}